

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

int __thiscall
QRegularExpressionPrivate::captureIndexForName(QRegularExpressionPrivate *this,QAnyStringView name)

{
  bool bVar1;
  QAnyStringView *this_00;
  QAnyStringView *in_RDI;
  long in_FS_OFFSET;
  int index;
  char16_t *currentNamedCapturingTableRow;
  uint i;
  uint namedCapturingTableEntrySize;
  uint namedCapturingTableEntryCount;
  PCRE2_SPTR16 *namedCapturingTable;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint local_54;
  uint local_44;
  int local_28;
  uint local_24;
  undefined1 *local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI[2].m_size == 0) {
    local_44 = 0xffffffff;
  }
  else {
    local_20[0] = &DAT_aaaaaaaaaaaaaaaa;
    local_24 = 0xaaaaaaaa;
    local_28 = -0x55555556;
    pcre2_pattern_info_16(in_RDI[2].m_size,0x13,local_20);
    pcre2_pattern_info_16(in_RDI[2].m_size,0x11,&local_24);
    pcre2_pattern_info_16(in_RDI[2].m_size,0x12,&local_28);
    for (local_54 = 0; local_54 < local_24; local_54 = local_54 + 1) {
      this_00 = (QAnyStringView *)(local_20[0] + (ulong)(local_28 * local_54) * 2);
      QAnyStringView::QAnyStringView<const_char16_t_*,_true>
                (this_00,(char16_t **)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98))
      ;
      bVar1 = ::operator==(in_RDI,(QAnyStringView *)
                                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      if (bVar1) {
        local_44 = (uint)*(ushort *)&this_00->field_0;
        goto LAB_0072c9d6;
      }
    }
    local_44 = 0xffffffff;
  }
LAB_0072c9d6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_44;
  }
  __stack_chk_fail();
}

Assistant:

int QRegularExpressionPrivate::captureIndexForName(QAnyStringView name) const
{
    Q_ASSERT(!name.isEmpty());

    if (!compiledPattern)
        return -1;

    // See the other usages of pcre2_pattern_info_16 for more details about this
    PCRE2_SPTR16 *namedCapturingTable;
    unsigned int namedCapturingTableEntryCount;
    unsigned int namedCapturingTableEntrySize;

    pcre2_pattern_info_16(compiledPattern, PCRE2_INFO_NAMETABLE, &namedCapturingTable);
    pcre2_pattern_info_16(compiledPattern, PCRE2_INFO_NAMECOUNT, &namedCapturingTableEntryCount);
    pcre2_pattern_info_16(compiledPattern, PCRE2_INFO_NAMEENTRYSIZE, &namedCapturingTableEntrySize);

    for (unsigned int i = 0; i < namedCapturingTableEntryCount; ++i) {
        const auto currentNamedCapturingTableRow =
                reinterpret_cast<const char16_t *>(namedCapturingTable) + namedCapturingTableEntrySize * i;

        if (name == (currentNamedCapturingTableRow + 1)) {
            const int index = *currentNamedCapturingTableRow;
            return index;
        }
    }

    return -1;
}